

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O1

int __thiscall CDataFileWriter::AddDataSwapped(CDataFileWriter *this,int Size,void *pData)

{
  int iVar1;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/datafile.cpp"
                 ,0x260,(uint)((Size & 3U) == 0),"incorrect boundary");
  iVar1 = AddData(this,Size,pData);
  return iVar1;
}

Assistant:

int CDataFileWriter::AddDataSwapped(int Size, const void *pData)
{
	dbg_assert(Size%sizeof(int) == 0, "incorrect boundary");

#if defined(CONF_ARCH_ENDIAN_BIG)
	void *pSwapped = mem_alloc(Size); // temporary buffer that we use during compression
	mem_copy(pSwapped, pData, Size);
	swap_endian(pSwapped, sizeof(int), Size/sizeof(int));
	int Index = AddData(Size, pSwapped);
	mem_free(pSwapped);
	return Index;
#else
	return AddData(Size, pData);
#endif
}